

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O0

MaybeResult<wasm::Ok> *
wasm::WATParser::elem<wasm::WATParser::ParseModuleTypesCtx>
          (MaybeResult<wasm::Ok> *__return_storage_ptr__,ParseModuleTypesCtx *ctx)

{
  __index_type *this;
  Name NVar1;
  Name NVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  size_t sVar6;
  Name *pNVar7;
  size_t i;
  Type *pTVar8;
  Err *pEVar9;
  Ok *pOVar10;
  bool bVar11;
  basic_string_view<char,_std::char_traits<char>_> bVar12;
  Ok local_489;
  Err local_488;
  Err *local_468;
  Err *err_6;
  size_t local_458;
  char *pcStack_450;
  undefined1 local_448 [8];
  Result<wasm::Ok> _val_6;
  Err *err_5;
  undefined1 local_3e0 [8];
  Result<wasm::Ok> _val_5;
  string local_3b0;
  Err local_390;
  Err local_370;
  Err *local_350;
  Err *err_4;
  Result<wasm::Type> _val_4;
  Result<wasm::Type> elems;
  undefined1 local_2f0 [6];
  bool legacy;
  Err local_2d0;
  Err local_2b0;
  Err *local_290;
  Err *err_3;
  Result<wasm::Ok> _val_3;
  Result<wasm::Ok> off_1;
  Err *err_2;
  MaybeResult<wasm::Ok> _val_2;
  MaybeResult<wasm::Ok> inst;
  size_t beforeLParen;
  Err *local_198;
  Err *err_1;
  Result<wasm::Ok> _val_1;
  Result<wasm::Ok> off;
  Err local_128;
  Err *local_108;
  Err *err;
  MaybeResult<wasm::Ok> _val;
  optional<wasm::Ok> local_8a;
  undefined1 local_88 [6];
  optional<wasm::Ok> offset;
  MaybeResult<wasm::Ok> table;
  undefined1 local_58 [7];
  bool isDeclare;
  optional<wasm::Name> id;
  Name name;
  Index local_20;
  size_t pos;
  ParseModuleTypesCtx *ctx_local;
  
  sVar6 = Lexer::getPos(&ctx->in);
  bVar12 = sv("elem",4);
  bVar4 = Lexer::takeSExprStart(&ctx->in,bVar12);
  if (!bVar4) {
    MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  wasm::Name::Name((Name *)&id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                            super__Optional_payload_base<wasm::Name>._M_engaged);
  Lexer::takeID((optional<wasm::Name> *)local_58,&ctx->in);
  bVar4 = std::optional::operator_cast_to_bool((optional *)local_58);
  if (bVar4) {
    pNVar7 = std::optional<wasm::Name>::operator*((optional<wasm::Name> *)local_58);
    wasm::Name::operator=
              ((Name *)&id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                        super__Optional_payload_base<wasm::Name>._M_engaged,pNVar7);
  }
  bVar4 = false;
  MaybeResult<wasm::Ok>::MaybeResult((MaybeResult<wasm::Ok> *)local_88);
  std::optional<wasm::Ok>::optional(&local_8a);
  bVar12 = sv("declare",7);
  bVar5 = Lexer::takeKeyword(&ctx->in,bVar12);
  if (bVar5) {
    bVar4 = true;
  }
  else {
    maybeTableuse<wasm::WATParser::ParseModuleTypesCtx>
              ((MaybeResult<wasm::Ok> *)
               ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20),ctx);
    this = (__index_type *)
           ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20);
    MaybeResult<wasm::Ok>::operator=
              ((MaybeResult<wasm::Ok> *)local_88,(MaybeResult<wasm::Ok> *)this);
    MaybeResult<wasm::Ok>::~MaybeResult((MaybeResult<wasm::Ok> *)this);
    MaybeResult<wasm::Ok>::MaybeResult
              ((MaybeResult<wasm::Ok> *)&err,(MaybeResult<wasm::Ok> *)local_88);
    local_108 = MaybeResult<wasm::Ok>::getErr((MaybeResult<wasm::Ok> *)&err);
    bVar5 = local_108 != (Err *)0x0;
    if (bVar5) {
      wasm::Err::Err(&local_128,local_108);
      MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_128);
      wasm::Err::~Err(&local_128);
    }
    MaybeResult<wasm::Ok>::~MaybeResult((MaybeResult<wasm::Ok> *)&err);
    if (bVar5) goto LAB_02419e8f;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               ((long)&off.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),"offset");
    bVar5 = Lexer::takeSExprStart(&ctx->in,stack0xfffffffffffffec0);
    if (bVar5) {
      expr<wasm::WATParser::ParseModuleTypesCtx>
                ((Result<wasm::Ok> *)
                 ((long)&_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),ctx);
      Result<wasm::Ok>::Result
                ((Result<wasm::Ok> *)&err_1,
                 (Result<wasm::Ok> *)
                 ((long)&_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
      local_198 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)&err_1);
      bVar5 = local_198 != (Err *)0x0;
      if (bVar5) {
        wasm::Err::Err((Err *)&beforeLParen,local_198);
        MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,(Err *)&beforeLParen);
        wasm::Err::~Err((Err *)&beforeLParen);
      }
      Result<wasm::Ok>::~Result((Result<wasm::Ok> *)&err_1);
      if (!bVar5) {
        pOVar10 = Result<wasm::Ok>::operator*
                            ((Result<wasm::Ok> *)
                             ((long)&_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
        std::optional<wasm::Ok>::operator=(&local_8a,pOVar10);
      }
      Result<wasm::Ok>::~Result
                ((Result<wasm::Ok> *)
                 ((long)&_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
      if (bVar5 && bVar5) goto LAB_02419e8f;
    }
    else {
      i = Lexer::getPos(&ctx->in);
      bVar5 = Lexer::takeLParen(&ctx->in);
      if (bVar5) {
        instr<wasm::WATParser::ParseModuleTypesCtx>
                  ((MaybeResult<wasm::Ok> *)
                   ((long)&_val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20),ctx);
        bVar5 = wasm::MaybeResult::operator_cast_to_bool
                          ((MaybeResult *)
                           ((long)&_val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                                   super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                   super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                   super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                   super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20));
        if (bVar5) {
          MaybeResult<wasm::Ok>::MaybeResult
                    ((MaybeResult<wasm::Ok> *)&err_2,
                     (MaybeResult<wasm::Ok> *)
                     ((long)&_val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20));
          pEVar9 = MaybeResult<wasm::Ok>::getErr((MaybeResult<wasm::Ok> *)&err_2);
          bVar5 = pEVar9 != (Err *)0x0;
          if (bVar5) {
            wasm::Err::Err((Err *)((long)&off_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                          super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                          super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),pEVar9
                          );
            MaybeResult<wasm::Ok>::MaybeResult
                      (__return_storage_ptr__,
                       (Err *)((long)&off_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                      super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                      super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                      super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
            wasm::Err::~Err((Err *)((long)&off_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                           super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                           super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
          }
          MaybeResult<wasm::Ok>::~MaybeResult((MaybeResult<wasm::Ok> *)&err_2);
          if (!bVar5) {
            NullInstrParserCtx::makeExpr
                      ((Result<wasm::Ok> *)
                       ((long)&_val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                               super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),
                       (NullInstrParserCtx *)ctx);
            Result<wasm::Ok>::Result
                      ((Result<wasm::Ok> *)&err_3,
                       (Result<wasm::Ok> *)
                       ((long)&_val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                               super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
            local_290 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)&err_3);
            bVar11 = local_290 != (Err *)0x0;
            if (bVar11) {
              wasm::Err::Err(&local_2b0,local_290);
              MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_2b0);
              wasm::Err::~Err(&local_2b0);
            }
            Result<wasm::Ok>::~Result((Result<wasm::Ok> *)&err_3);
            if (!bVar11) {
              pOVar10 = Result<wasm::Ok>::operator*
                                  ((Result<wasm::Ok> *)
                                   ((long)&_val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                           super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                           super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
              std::optional<wasm::Ok>::operator=(&local_8a,pOVar10);
            }
            bVar3 = bVar11;
            bVar5 = bVar3 && bVar11;
            Result<wasm::Ok>::~Result
                      ((Result<wasm::Ok> *)
                       ((long)&_val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                               super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
            if (!bVar3 || !bVar11) goto LAB_02419814;
          }
        }
        else {
          Lexer::setPos(&ctx->in,i);
LAB_02419814:
          bVar5 = false;
        }
        MaybeResult<wasm::Ok>::~MaybeResult
                  ((MaybeResult<wasm::Ok> *)
                   ((long)&_val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20));
        if (bVar5) goto LAB_02419e8f;
      }
    }
    bVar5 = std::optional::operator_cast_to_bool((optional *)&local_8a);
    if ((bVar5) && (bVar5 = Lexer::takeRParen(&ctx->in), !bVar5)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_2f0,"expected end of offset expression",
                 (allocator<char> *)
                 ((long)&elems.val.super__Variant_base<wasm::Type,_wasm::Err>.
                         super__Move_assign_alias<wasm::Type,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x27));
      Lexer::err(&local_2d0,&ctx->in,(string *)local_2f0);
      MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_2d0);
      wasm::Err::~Err(&local_2d0);
      std::__cxx11::string::~string((string *)local_2f0);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&elems.val.super__Variant_base<wasm::Type,_wasm::Err>.
                         super__Move_assign_alias<wasm::Type,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x27));
      goto LAB_02419e8f;
    }
  }
  bVar5 = wasm::MaybeResult::operator_cast_to_bool((MaybeResult *)local_88);
  elems.val.super__Variant_base<wasm::Type,_wasm::Err>.
  super__Move_assign_alias<wasm::Type,_wasm::Err>.super__Copy_assign_alias<wasm::Type,_wasm::Err>.
  super__Move_ctor_alias<wasm::Type,_wasm::Err>.super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
  super__Variant_storage_alias<wasm::Type,_wasm::Err>._38_1_ = !bVar5;
  elemlist<wasm::WATParser::ParseModuleTypesCtx>
            ((Result<wasm::Type> *)
             ((long)&_val_4.val.super__Variant_base<wasm::Type,_wasm::Err>.
                     super__Move_assign_alias<wasm::Type,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20),ctx,
             (bool)elems.val.super__Variant_base<wasm::Type,_wasm::Err>.
                   super__Move_assign_alias<wasm::Type,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Type,_wasm::Err>._38_1_);
  Result<wasm::Type>::Result
            ((Result<wasm::Type> *)&err_4,
             (Result<wasm::Type> *)
             ((long)&_val_4.val.super__Variant_base<wasm::Type,_wasm::Err>.
                     super__Move_assign_alias<wasm::Type,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20));
  local_350 = Result<wasm::Type>::getErr((Result<wasm::Type> *)&err_4);
  bVar5 = local_350 == (Err *)0x0;
  if (!bVar5) {
    wasm::Err::Err(&local_370,local_350);
    MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_370);
    wasm::Err::~Err(&local_370);
  }
  Result<wasm::Type>::~Result((Result<wasm::Type> *)&err_4);
  if (bVar5) {
    bVar5 = Lexer::takeRParen(&ctx->in);
    if (bVar5) {
      local_20 = (Index)sVar6;
      if (bVar4) {
        pTVar8 = Result<wasm::Type>::operator*
                           ((Result<wasm::Type> *)
                            ((long)&_val_4.val.super__Variant_base<wasm::Type,_wasm::Err>.
                                    super__Move_assign_alias<wasm::Type,_wasm::Err>.
                                    super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                                    super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                                    super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20));
        NVar2.super_IString.str._M_str = (char *)name.super_IString.str._M_len;
        NVar2.super_IString.str._M_len =
             id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
             super__Optional_payload_base<wasm::Name>._16_8_;
        ParseModuleTypesCtx::addDeclareElem((Result<wasm::Ok> *)local_3e0,ctx,NVar2,pTVar8,local_20)
        ;
        pEVar9 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)local_3e0);
        bVar4 = pEVar9 == (Err *)0x0;
        if (!bVar4) {
          wasm::Err::Err((Err *)((long)&_val_6.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                        super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                        super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                        super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),pEVar9);
          MaybeResult<wasm::Ok>::MaybeResult
                    (__return_storage_ptr__,
                     (Err *)((long)&_val_6.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                    super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                    super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                    super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                    super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
          wasm::Err::~Err((Err *)((long)&_val_6.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                         super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                         super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                         super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                         super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
        }
        Result<wasm::Ok>::~Result((Result<wasm::Ok> *)local_3e0);
      }
      else {
        local_458 = id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                    super__Optional_payload_base<wasm::Name>._16_8_;
        pcStack_450 = (char *)name.super_IString.str._M_len;
        pOVar10 = MaybeResult<wasm::Ok>::getPtr((MaybeResult<wasm::Ok> *)local_88);
        err_6._6_2_ = (_Optional_payload<wasm::Ok,_true,_true,_true>)
                      (_Optional_payload<wasm::Ok,_true,_true,_true>)
                      local_8a.super__Optional_base<wasm::Ok,_true,_true>._M_payload.
                      super__Optional_payload_base<wasm::Ok>;
        pTVar8 = Result<wasm::Type>::operator*
                           ((Result<wasm::Type> *)
                            ((long)&_val_4.val.super__Variant_base<wasm::Type,_wasm::Err>.
                                    super__Move_assign_alias<wasm::Type,_wasm::Err>.
                                    super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                                    super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                                    super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20));
        NVar1.super_IString.str._M_str = pcStack_450;
        NVar1.super_IString.str._M_len = local_458;
        ParseModuleTypesCtx::addElem
                  ((Result<wasm::Ok> *)local_448,ctx,NVar1,pOVar10,(optional<wasm::Ok>)err_6._6_2_,
                   pTVar8,local_20);
        local_468 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)local_448);
        bVar4 = local_468 == (Err *)0x0;
        if (!bVar4) {
          wasm::Err::Err(&local_488,local_468);
          MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_488);
          wasm::Err::~Err(&local_488);
        }
        Result<wasm::Ok>::~Result((Result<wasm::Ok> *)local_448);
      }
      if (bVar4) {
        MaybeResult<wasm::Ok>::MaybeResult<wasm::Ok>(__return_storage_ptr__,&local_489);
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3b0,"expected end of element segment",
                 (allocator<char> *)
                 ((long)&_val_5.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x27));
      Lexer::err(&local_390,&ctx->in,&local_3b0);
      MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_390);
      wasm::Err::~Err(&local_390);
      std::__cxx11::string::~string((string *)&local_3b0);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&_val_5.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x27));
    }
  }
  Result<wasm::Type>::~Result
            ((Result<wasm::Type> *)
             ((long)&_val_4.val.super__Variant_base<wasm::Type,_wasm::Err>.
                     super__Move_assign_alias<wasm::Type,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Type,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Type,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Type,_wasm::Err> + 0x20));
LAB_02419e8f:
  MaybeResult<wasm::Ok>::~MaybeResult((MaybeResult<wasm::Ok> *)local_88);
  return __return_storage_ptr__;
}

Assistant:

MaybeResult<> elem(Ctx& ctx) {
  auto pos = ctx.in.getPos();
  if (!ctx.in.takeSExprStart("elem"sv)) {
    return {};
  }

  Name name;
  if (auto id = ctx.in.takeID()) {
    name = *id;
  }

  bool isDeclare = false;
  MaybeResult<typename Ctx::TableIdxT> table;
  std::optional<typename Ctx::ExprT> offset;

  if (ctx.in.takeKeyword("declare"sv)) {
    isDeclare = true;
  } else {
    table = maybeTableuse(ctx);
    CHECK_ERR(table);

    if (ctx.in.takeSExprStart("offset")) {
      auto off = expr(ctx);
      CHECK_ERR(off);
      offset = *off;
    } else {
      // This may be an abbreviated offset instruction or it may be the
      // beginning of the elemlist.
      auto beforeLParen = ctx.in.getPos();
      if (ctx.in.takeLParen()) {
        if (auto inst = instr(ctx)) {
          CHECK_ERR(inst);
          auto off = ctx.makeExpr();
          CHECK_ERR(off);
          offset = *off;
        } else {
          // This must be the beginning of the elemlist instead.
          ctx.in.setPos(beforeLParen);
        }
      }
    }
    if (offset && !ctx.in.takeRParen()) {
      return ctx.in.err("expected end of offset expression");
    }
  }

  // If there is no explicit tableuse, we can use the legacy elemlist format.
  bool legacy = !table;
  auto elems = elemlist(ctx, legacy);
  CHECK_ERR(elems);

  if (!ctx.in.takeRParen()) {
    return ctx.in.err("expected end of element segment");
  }

  if (isDeclare) {
    CHECK_ERR(ctx.addDeclareElem(name, std::move(*elems), pos));
  } else {
    CHECK_ERR(
      ctx.addElem(name, table.getPtr(), offset, std::move(*elems), pos));
  }

  return Ok{};
}